

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

void __thiscall re2::DFA::~DFA(DFA *this)

{
  Workq *pWVar1;
  int iVar2;
  
  pWVar1 = this->q0_;
  if (pWVar1 != (Workq *)0x0) {
    SparseSet::~SparseSet(&pWVar1->super_SparseSet);
  }
  operator_delete(pWVar1);
  pWVar1 = this->q1_;
  if (pWVar1 != (Workq *)0x0) {
    SparseSet::~SparseSet(&pWVar1->super_SparseSet);
  }
  operator_delete(pWVar1);
  if (this->astack_ != (int *)0x0) {
    operator_delete__(this->astack_);
  }
  ClearCache(this);
  std::
  _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->state_cache_)._M_h);
  iVar2 = pthread_rwlock_destroy((pthread_rwlock_t *)&this->cache_mutex_);
  if (iVar2 == 0) {
    iVar2 = pthread_rwlock_destroy((pthread_rwlock_t *)&this->mutex_);
    if (iVar2 == 0) {
      return;
    }
  }
  abort();
}

Assistant:

DFA::~DFA() {
  delete q0_;
  delete q1_;
  delete[] astack_;
  ClearCache();
}